

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

wchar_t best_effort_strncat_in_locale
                  (archive_string *as,void *_p,size_t length,archive_string_conv *sc)

{
  char cVar1;
  archive_string *paVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  wchar_t wVar7;
  char *p;
  wchar_t local_3c;
  mbstate_t_conflict shift_state;
  
  if (sc->same == L'\0') {
    paVar2 = archive_string_ensure(as,length + as->length + 1);
    if (paVar2 != (archive_string *)0x0) {
      pcVar4 = as->s + as->length;
      uVar5 = ~as->length + as->buffer_length;
      wVar7 = L'\0';
      for (lVar6 = length + 3; (cVar1 = *_p, cVar1 != '\0' && (lVar6 != 3)); lVar6 = lVar6 + -1) {
        if (cVar1 < '\0') {
          if ((sc->flag & L'Ā') == L'\0') {
            *pcVar4 = '?';
            pcVar4 = pcVar4 + 1;
          }
          else {
            if (uVar5 < 3) {
              as->length = (long)pcVar4 - (long)as->s;
              paVar2 = archive_string_ensure(as,as->buffer_length + lVar6);
              if (paVar2 == (archive_string *)0x0) {
                return L'\xffffffff';
              }
              pcVar4 = as->s + as->length;
              uVar5 = ~as->length + as->buffer_length;
            }
            pcVar4[0] = -0x11;
            pcVar4[1] = -0x41;
            pcVar4[2] = -0x43;
            pcVar4 = pcVar4 + 3;
            uVar5 = uVar5 - 3;
          }
          wVar7 = L'\xffffffff';
        }
        else {
          *pcVar4 = cVar1;
          pcVar4 = pcVar4 + 1;
        }
        _p = (void *)((long)_p + 1);
      }
      as->length = (long)pcVar4 - (long)as->s;
      *pcVar4 = '\0';
      return wVar7;
    }
  }
  else {
    paVar2 = archive_string_append(as,(char *)_p,length);
    if (paVar2 != (archive_string *)0x0) {
      shift_state.__count = L'\0';
      shift_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
      while( true ) {
        if (length == 0) {
          return L'\0';
        }
        sVar3 = mbrtowc(&local_3c,(char *)_p,length,(mbstate_t *)&shift_state);
        if (0xfffffffffffffffd < sVar3) break;
        if (sVar3 == 0) {
          return L'\0';
        }
        _p = (void *)((long)_p + sVar3);
        length = length - sVar3;
      }
    }
  }
  return L'\xffffffff';
}

Assistant:

static int
best_effort_strncat_in_locale(struct archive_string *as, const void *_p,
    size_t length, struct archive_string_conv *sc)
{
	size_t remaining;
	char *otp;
	const uint8_t *itp;
	size_t avail;
	int return_value = 0; /* success */

	/*
	 * If both from-locale and to-locale is the same, this makes a copy.
	 * And then this checks all copied MBS can be WCS if so returns 0.
	 */
	if (sc->same) {
		if (archive_string_append(as, _p, length) == NULL)
			return (-1);/* No memory */
		return (invalid_mbs(_p, length, sc));
	}

	/*
	 * If a character is ASCII, this just copies it. If not, this
	 * assigns '?' charater instead but in UTF-8 locale this assigns
	 * byte sequence 0xEF 0xBD 0xBD, which are code point U+FFFD,
	 * a Replacement Character in Unicode.
	 */
	if (archive_string_ensure(as, as->length + length + 1) == NULL)
		return (-1);

	remaining = length;
	itp = (const uint8_t *)_p;
	otp = as->s + as->length;
	avail = as->buffer_length - as->length -1;
	while (*itp && remaining > 0) {
		if (*itp > 127 && (sc->flag & SCONV_TO_UTF8)) {
			if (avail < UTF8_R_CHAR_SIZE) {
				as->length = otp - as->s;
				if (NULL == archive_string_ensure(as,
				    as->buffer_length + remaining +
				    UTF8_R_CHAR_SIZE))
					return (-1);
				otp = as->s + as->length;
				avail = as->buffer_length - as->length -1;
			}
			/*
		 	 * When coping a string in UTF-8, unknown character
			 * should be U+FFFD (replacement character).
			 */
			UTF8_SET_R_CHAR(otp);
			otp += UTF8_R_CHAR_SIZE;
			avail -= UTF8_R_CHAR_SIZE;
			itp++;
			remaining--;
			return_value = -1;
		} else if (*itp > 127) {
			*otp++ = '?';
			itp++;
			remaining--;
			return_value = -1;
		} else {
			*otp++ = (char)*itp++;
			remaining--;
		}
	}
	as->length = otp - as->s;
	as->s[as->length] = '\0';
	return (return_value);
}